

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O1

QString * __thiscall
QAccessibleMessageBox::text(QString *__return_storage_ptr__,QAccessibleMessageBox *this,Text t)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QWidget *pQVar4;
  longlong __tmp;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (t == Help) {
    pQVar4 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
    QMessageBox::informativeText(&local_38,(QMessageBox *)pQVar4);
LAB_00530510:
    pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    *(undefined4 *)&(__return_storage_ptr__->d).d = local_38.d.d._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38.d.d._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_38.d.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_38.d.ptr._4_4_;
    qVar3 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_38.d.size;
    local_38.d.d = (Data *)pQVar1;
    local_38.d.ptr = pcVar2;
    local_38.d.size = qVar3;
  }
  else {
    if (t == Value) {
      pQVar4 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
      QMessageBox::text(&local_38,(QMessageBox *)pQVar4);
      goto LAB_00530510;
    }
    if (t == Name) {
      QAccessibleWidget::text(&local_38,&this->super_QAccessibleWidget,Name);
      pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar2 = (__return_storage_ptr__->d).ptr;
      *(undefined4 *)&(__return_storage_ptr__->d).d = local_38.d.d._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38.d.d._4_4_;
      *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_38.d.ptr._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_38.d.ptr._4_4_;
      qVar3 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_38.d.size;
      local_38.d.d = (Data *)pQVar1;
      local_38.d.ptr = pcVar2;
      local_38.d.size = qVar3;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      if ((__return_storage_ptr__->d).size != 0) goto LAB_00530581;
      pQVar4 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
      QMessageBox::text(&local_38,(QMessageBox *)pQVar4);
      pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar2 = (__return_storage_ptr__->d).ptr;
      *(undefined4 *)&(__return_storage_ptr__->d).d = local_38.d.d._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38.d.d._4_4_;
      *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_38.d.ptr._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_38.d.ptr._4_4_;
      (__return_storage_ptr__->d).size = local_38.d.size;
      local_38.d.d = (Data *)pQVar1;
      local_38.d.ptr = pcVar2;
      local_38.d.size = 0;
    }
    else {
      QAccessibleWidget::text(&local_38,&this->super_QAccessibleWidget,t);
      pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar2 = (__return_storage_ptr__->d).ptr;
      *(undefined4 *)&(__return_storage_ptr__->d).d = local_38.d.d._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38.d.d._4_4_;
      *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_38.d.ptr._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_38.d.ptr._4_4_;
      qVar3 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_38.d.size;
      local_38.d.d = (Data *)pQVar1;
      local_38.d.ptr = pcVar2;
      local_38.d.size = qVar3;
    }
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00530581:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleMessageBox::text(QAccessible::Text t) const
{
    QString str;

    switch (t) {
    case QAccessible::Name:
        str = QAccessibleWidget::text(t);
        if (str.isEmpty()) // implies no title text is set
            str = messageBox()->text();
        break;
    case QAccessible::Value:
        str = messageBox()->text();
        break;
    case QAccessible::Help:
        str = messageBox()->informativeText();
        break;
    default:
        str = QAccessibleWidget::text(t);
        break;
    }

    return str;
}